

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_CalculateEachTest_Test::TestBody
          (ConfidentialTransaction_CalculateEachTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_3;
  ConfidentialAssetId local_f8;
  AssertHelper local_d0;
  ByteData256 contract_hash;
  BlindFactor entropy;
  ConfidentialAssetId asset;
  ConfidentialAssetId token;
  ByteData256 contract_hash_empty;
  Txid txid;
  
  std::__cxx11::string::string
            ((string *)&asset,"d1efb621591f94f66a9c3161addd6d7db0ae82cc1674e3b098051793fb70028a",
             (allocator *)&token);
  cfd::core::Txid::Txid(&txid,(string *)&asset);
  std::__cxx11::string::~string((string *)&asset);
  cfd::core::ByteData256::ByteData256(&contract_hash_empty);
  cfd::core::BlindFactor::BlindFactor(&entropy);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&token);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::CalculateAssetEntropy
                ((BlindFactor *)&local_f8,&txid,1,&contract_hash_empty);
      cfd::core::BlindFactor::operator=(&entropy,(BlindFactor *)&local_f8);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&contract_hash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5fc,
               "Expected: (entropy = ConfidentialTransaction::CalculateAssetEntropy( txid, vout, contract_hash_empty)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&contract_hash,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&contract_hash);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_f8,&entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&contract_hash,"entropy.GetHex().c_str()",
             "\"18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c\"",
             (char *)local_f8._vptr_ConfidentialAssetId,
             "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  std::__cxx11::string::~string((string *)&local_f8);
  if ((char)contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if (contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)contract_hash.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5ff,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&contract_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::CalculateAsset(&local_f8,&entropy);
      cfd::core::ConfidentialAssetId::operator=(&asset,&local_f8);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&contract_hash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x600,
               "Expected: (asset = ConfidentialTransaction::CalculateAsset(entropy)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&contract_hash,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&contract_hash);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_f8,&asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&contract_hash,"asset.GetHex().c_str()",
             "\"598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07\"",
             (char *)local_f8._vptr_ConfidentialAssetId,
             "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  std::__cxx11::string::~string((string *)&local_f8);
  if ((char)contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if (contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)contract_hash.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x603,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&contract_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::CalculateReissuanceToken(&local_f8,&entropy,false);
      cfd::core::ConfidentialAssetId::operator=(&token,&local_f8);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&contract_hash,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x605,
               "Expected: (token = ConfidentialTransaction::CalculateReissuanceToken(entropy, false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&contract_hash,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&contract_hash);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_f8,&token);
  testing::internal::CmpHelperSTREQ
            ((internal *)&contract_hash,"token.GetHex().c_str()",
             "\"4dda0f2bc939213feae25a16dcade5f235ab28564d56dc4f7f69d977d441f993\"",
             (char *)local_f8._vptr_ConfidentialAssetId,
             "4dda0f2bc939213feae25a16dcade5f235ab28564d56dc4f7f69d977d441f993");
  std::__cxx11::string::~string((string *)&local_f8);
  if ((char)contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if (contract_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)contract_hash.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x608,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&contract_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  std::__cxx11::string::string
            ((string *)&local_f8,"fdf4d615b2b78b61c85ccd5129584dc1b7cbd6c75a1c799cc0738bc783dafd68",
             (allocator *)&gtest_ar_3);
  cfd::core::ByteData256::ByteData256(&contract_hash,(string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::CalculateAssetEntropy
                ((BlindFactor *)&local_f8,&txid,1,&contract_hash);
      cfd::core::BlindFactor::operator=(&entropy,(BlindFactor *)&local_f8);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x60f,
               "Expected: (entropy = ConfidentialTransaction::CalculateAssetEntropy( txid, vout, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_f8,&entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"entropy.GetHex().c_str()",
             "\"9ed3d5d8f571d5b6ad03b5d17cee4fec1de36b65f4eb7d84aad264ddf260c09c\"",
             (char *)local_f8._vptr_ConfidentialAssetId,
             "9ed3d5d8f571d5b6ad03b5d17cee4fec1de36b65f4eb7d84aad264ddf260c09c");
  std::__cxx11::string::~string((string *)&local_f8);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x612,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::CalculateAsset(&local_f8,&entropy);
      cfd::core::ConfidentialAssetId::operator=(&asset,&local_f8);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x613,
               "Expected: (asset = ConfidentialTransaction::CalculateAsset(entropy)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_f8,&asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"asset.GetHex().c_str()",
             "\"76ab84689c4b03e254c89188962d262d159d21b4f1ccdfaf061d79dd53ddf303\"",
             (char *)local_f8._vptr_ConfidentialAssetId,
             "76ab84689c4b03e254c89188962d262d159d21b4f1ccdfaf061d79dd53ddf303");
  std::__cxx11::string::~string((string *)&local_f8);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x616,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::CalculateReissuanceToken(&local_f8,&entropy,false);
      cfd::core::ConfidentialAssetId::operator=(&token,&local_f8);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x618,
               "Expected: (token = ConfidentialTransaction::CalculateReissuanceToken(entropy, false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_f8,&token);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"token.GetHex().c_str()",
             "\"e9aab5dcff7203b1dd77d42b727058835eb0034b3fad91e6d2bb69c21d7a5879\"",
             (char *)local_f8._vptr_ConfidentialAssetId,
             "e9aab5dcff7203b1dd77d42b727058835eb0034b3fad91e6d2bb69c21d7a5879");
  std::__cxx11::string::~string((string *)&local_f8);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x61b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::CalculateAssetEntropy
                ((BlindFactor *)&local_f8,&txid,1,&contract_hash_empty);
      cfd::core::BlindFactor::operator=(&entropy,(BlindFactor *)&local_f8);
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)&local_f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x620,
               "Expected: (entropy = ConfidentialTransaction::CalculateAssetEntropy( txid, vout, contract_hash_empty)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_f8,&entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"entropy.GetHex().c_str()",
             "\"18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c\"",
             (char *)local_f8._vptr_ConfidentialAssetId,
             "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  std::__cxx11::string::~string((string *)&local_f8);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x623,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::CalculateAsset(&local_f8,&entropy);
      cfd::core::ConfidentialAssetId::operator=(&asset,&local_f8);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x624,
               "Expected: (asset = ConfidentialTransaction::CalculateAsset(entropy)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_f8,&asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"asset.GetHex().c_str()",
             "\"598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07\"",
             (char *)local_f8._vptr_ConfidentialAssetId,
             "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  std::__cxx11::string::~string((string *)&local_f8);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x627,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::CalculateReissuanceToken(&local_f8,&entropy,true);
      cfd::core::ConfidentialAssetId::operator=(&token,&local_f8);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x629,
               "Expected: (token = ConfidentialTransaction::CalculateReissuanceToken(entropy, true)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)&local_f8,&token);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_3,"token.GetHex().c_str()",
             "\"3b4a21657d88d5004008ccf00441270a20984228eb06289660b63b475b539610\"",
             (char *)local_f8._vptr_ConfidentialAssetId,
             "3b4a21657d88d5004008ccf00441270a20984228eb06289660b63b475b539610");
  std::__cxx11::string::~string((string *)&local_f8);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_f8);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x62c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&token);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
  cfd::core::BlindFactor::~BlindFactor(&entropy);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash_empty);
  cfd::core::Txid::~Txid(&txid);
  return;
}

Assistant:

TEST(ConfidentialTransaction, CalculateEachTest) {
  Txid txid("d1efb621591f94f66a9c3161addd6d7db0ae82cc1674e3b098051793fb70028a");
  uint32_t vout = 1;
  ByteData256 contract_hash_empty;
  BlindFactor entropy;
  ConfidentialAssetId asset;
  ConfidentialAssetId token;

  // not blind
  EXPECT_NO_THROW(
      (entropy = ConfidentialTransaction::CalculateAssetEntropy(
          txid, vout, contract_hash_empty)));
  EXPECT_STREQ(
      entropy.GetHex().c_str(),
      "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  EXPECT_NO_THROW((asset = ConfidentialTransaction::CalculateAsset(entropy)));
  EXPECT_STREQ(
      asset.GetHex().c_str(),
      "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  EXPECT_NO_THROW((token = 
      ConfidentialTransaction::CalculateReissuanceToken(entropy, false)));
  EXPECT_STREQ(
      token.GetHex().c_str(),
      "4dda0f2bc939213feae25a16dcade5f235ab28564d56dc4f7f69d977d441f993");

  // contract hash
  ByteData256 contract_hash(
      "fdf4d615b2b78b61c85ccd5129584dc1b7cbd6c75a1c799cc0738bc783dafd68");
  EXPECT_NO_THROW(
      (entropy = ConfidentialTransaction::CalculateAssetEntropy(
          txid, vout, contract_hash)));
  EXPECT_STREQ(
      entropy.GetHex().c_str(),
      "9ed3d5d8f571d5b6ad03b5d17cee4fec1de36b65f4eb7d84aad264ddf260c09c");
  EXPECT_NO_THROW((asset = ConfidentialTransaction::CalculateAsset(entropy)));
  EXPECT_STREQ(
      asset.GetHex().c_str(),
      "76ab84689c4b03e254c89188962d262d159d21b4f1ccdfaf061d79dd53ddf303");
  EXPECT_NO_THROW((token = 
      ConfidentialTransaction::CalculateReissuanceToken(entropy, false)));
  EXPECT_STREQ(
      token.GetHex().c_str(),
      "e9aab5dcff7203b1dd77d42b727058835eb0034b3fad91e6d2bb69c21d7a5879");

  // blind
  EXPECT_NO_THROW(
      (entropy = ConfidentialTransaction::CalculateAssetEntropy(
          txid, vout, contract_hash_empty)));
  EXPECT_STREQ(
      entropy.GetHex().c_str(),
      "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  EXPECT_NO_THROW((asset = ConfidentialTransaction::CalculateAsset(entropy)));
  EXPECT_STREQ(
      asset.GetHex().c_str(),
      "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  EXPECT_NO_THROW((token = 
      ConfidentialTransaction::CalculateReissuanceToken(entropy, true)));
  EXPECT_STREQ(
      token.GetHex().c_str(),
      "3b4a21657d88d5004008ccf00441270a20984228eb06289660b63b475b539610");
}